

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O0

VkBufferMemoryBarrier * __thiscall
myvk::BufferBase::GetMemoryBarrier
          (BufferBase *this,BufferSubresourceRange *region,VkAccessFlags src_access_mask,
          VkAccessFlags dst_access_mask,uint32_t src_queue_family,uint32_t dst_queue_family)

{
  VkAccessFlags in_ECX;
  VkDeviceSize *in_RDX;
  long in_RSI;
  VkBufferMemoryBarrier *in_RDI;
  VkAccessFlags in_R8D;
  uint32_t in_R9D;
  VkBufferMemoryBarrier *ret;
  
  memset(in_RDI,0,0x38);
  in_RDI->sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  in_RDI->size = in_RDX[1];
  in_RDI->buffer = *(VkBuffer *)(in_RSI + 0x18);
  in_RDI->offset = *in_RDX;
  in_RDI->srcAccessMask = in_ECX;
  in_RDI->dstAccessMask = in_R8D;
  in_RDI->srcQueueFamilyIndex = in_R9D;
  in_RDI->dstQueueFamilyIndex = (uint32_t)ret;
  return in_RDI;
}

Assistant:

VkBufferMemoryBarrier BufferBase::GetMemoryBarrier(const BufferSubresourceRange &region, VkAccessFlags src_access_mask,
                                                   VkAccessFlags dst_access_mask, uint32_t src_queue_family,
                                                   uint32_t dst_queue_family) const {
	VkBufferMemoryBarrier ret = {};
	ret.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
	ret.size = region.size;

	ret.buffer = m_buffer;
	ret.offset = region.offset;
	ret.srcAccessMask = src_access_mask;
	ret.dstAccessMask = dst_access_mask;
	ret.srcQueueFamilyIndex = src_queue_family;
	ret.dstQueueFamilyIndex = dst_queue_family;
	return ret;
}